

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O3

void Ivy_ManHaigStart(Ivy_Man_t *p,int fVerbose)

{
  undefined4 uVar1;
  undefined4 *puVar2;
  Ivy_Man_t *pIVar3;
  uint *puVar4;
  void *__ptr;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  uint uVar7;
  
  if (p->pHaig != (Ivy_Man_t *)0x0) {
    __assert_fail("p->pHaig == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyHaig.c"
                  ,99,"void Ivy_ManHaigStart(Ivy_Man_t *, int)");
  }
  pIVar3 = Ivy_ManDup(p);
  p->pHaig = pIVar3;
  if (fVerbose != 0) {
    printf("Starting : ");
    Ivy_ManPrintStats(p->pHaig);
    pIVar3 = p->pHaig;
  }
  puVar4 = (uint *)malloc(0x10);
  puVar4[0] = 100;
  puVar4[1] = 0;
  __ptr = malloc(400);
  *(void **)(puVar4 + 2) = __ptr;
  pVVar5 = pIVar3->vObjs;
  if (0 < pVVar5->nSize) {
    lVar6 = 0;
    do {
      puVar2 = (undefined4 *)pVVar5->pArray[lVar6];
      if ((puVar2 != (undefined4 *)0x0) && ((puVar2[2] & 0xf) == 4)) {
        puVar2[2] = puVar2[2] | 0x600;
        uVar1 = *puVar2;
        uVar7 = puVar4[1];
        if (uVar7 == *puVar4) {
          if ((int)uVar7 < 0x10) {
            if (__ptr == (void *)0x0) {
              __ptr = malloc(0x40);
            }
            else {
              __ptr = realloc(__ptr,0x40);
            }
            *(void **)(puVar4 + 2) = __ptr;
            uVar7 = 0x10;
            if (__ptr == (void *)0x0) {
LAB_0075d136:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
          }
          else {
            if (__ptr == (void *)0x0) {
              __ptr = malloc((ulong)uVar7 * 8);
            }
            else {
              __ptr = realloc(__ptr,(ulong)uVar7 * 8);
            }
            *(void **)(puVar4 + 2) = __ptr;
            if (__ptr == (void *)0x0) goto LAB_0075d136;
            uVar7 = uVar7 * 2;
          }
          *puVar4 = uVar7;
        }
        uVar7 = puVar4[1];
        puVar4[1] = uVar7 + 1;
        *(undefined4 *)((long)__ptr + (long)(int)uVar7 * 4) = uVar1;
        pIVar3 = p->pHaig;
      }
      lVar6 = lVar6 + 1;
      pVVar5 = pIVar3->vObjs;
    } while (lVar6 < pVVar5->nSize);
  }
  pIVar3->pData = puVar4;
  return;
}

Assistant:

void Ivy_ManHaigStart( Ivy_Man_t * p, int fVerbose )
{
    Vec_Int_t * vLatches;
    Ivy_Obj_t * pObj;
    int i;
    assert( p->pHaig == NULL );
    p->pHaig = Ivy_ManDup( p );

    if ( fVerbose )
    {
        printf( "Starting : " );
        Ivy_ManPrintStats( p->pHaig );
    }

    // collect latches of design D and set their values to be DC
    vLatches = Vec_IntAlloc( 100 );
    Ivy_ManForEachLatch( p->pHaig, pObj, i )
    {
        pObj->Init = IVY_INIT_DC;
        Vec_IntPush( vLatches, pObj->Id );
    }
    p->pHaig->pData = vLatches;
/*
    {
        int x;
        Ivy_ManShow( p, 0, NULL );
        Ivy_ManShow( p->pHaig, 1, NULL );
        x = 0;
    }
*/
}